

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O2

void __thiscall sfc::Image::save_scaled(Image *this,string *path,Mode mode)

{
  uint code;
  runtime_error *this_00;
  char *pcVar1;
  string sStack_88;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_68;
  byte_vec_t scaled_data;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_38;
  
  to_rgba((rgba_vec_t *)&local_38,&this->_data);
  reduce_colors((rgba_vec_t *)&local_68,(rgba_vec_t *)&local_38,mode);
  normalize_colors((rgba_vec_t *)&sStack_88,(rgba_vec_t *)&local_68,mode);
  to_bytes(&scaled_data,(rgba_vec_t *)&sStack_88);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&sStack_88);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_68);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sStack_88,(path->_M_dataplus)._M_p,(allocator<char> *)&local_68);
  code = lodepng::encode(&sStack_88,&scaled_data,this->_width,this->_height,LCT_RGBA,8);
  std::__cxx11::string::~string((string *)&sStack_88);
  if (code == 0) {
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&scaled_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  pcVar1 = lodepng_error_text(code);
  std::runtime_error::runtime_error(this_00,pcVar1);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Image::save_scaled(const std::string& path, Mode mode) {
  auto scaled_data = to_bytes(normalize_colors(reduce_colors(rgba_data(), mode), mode));
  unsigned error = lodepng::encode(path.c_str(), scaled_data, _width, _height, LCT_RGBA, 8);
  if (error)
    throw std::runtime_error(lodepng_error_text(error));
}